

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::handler_successful_return_struct_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_function *tfunc)

{
  t_field *tfield;
  int iVar1;
  ostream *poVar2;
  uint uVar3;
  pointer pptVar4;
  bool bVar5;
  vector<t_field_*,_std::allocator<t_field_*>_> members;
  string local_1c8;
  ostringstream return_struct;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&return_struct);
  service_call_result_struct_name_abi_cxx11_(&local_1c8,this,tfunc);
  poVar2 = std::operator<<(&return_struct.super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&local_1c8);
  std::operator<<(poVar2," { ");
  std::__cxx11::string::~string((string *)&local_1c8);
  iVar1 = (*(tfunc->returntype_->super_t_doc)._vptr_t_doc[4])();
  bVar5 = (char)iVar1 == '\0';
  if (bVar5) {
    std::operator<<(&return_struct.super_basic_ostream<char,_std::char_traits<char>_>,
                    "result_value: Some(handler_return)");
  }
  uVar3 = (uint)bVar5;
  if (tfunc->xceptions_ != (t_struct *)0x0) {
    std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
              (&members,&tfunc->xceptions_->members_in_id_order_);
    for (pptVar4 = members.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar4 !=
        members.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
      tfield = *pptVar4;
      if (uVar3 != 0) {
        std::operator<<(&return_struct.super_basic_ostream<char,_std::char_traits<char>_>,", ");
      }
      rust_field_name_abi_cxx11_(&local_1c8,this,tfield);
      poVar2 = std::operator<<(&return_struct.super_basic_ostream<char,_std::char_traits<char>_>,
                               (string *)&local_1c8);
      std::operator<<(poVar2,": None");
      std::__cxx11::string::~string((string *)&local_1c8);
      uVar3 = uVar3 + 1;
    }
    std::_Vector_base<t_field_*,_std::allocator<t_field_*>_>::~_Vector_base
              (&members.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>);
  }
  std::operator<<(&return_struct.super_basic_ostream<char,_std::char_traits<char>_>," }");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&return_struct);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::handler_successful_return_struct(t_function* tfunc) {
  int member_count = 0;
  ostringstream return_struct;

  return_struct << service_call_result_struct_name(tfunc) << " { ";

  // actual return
  if (!tfunc->get_returntype()->is_void()) {
    return_struct << "result_value: Some(handler_return)";
    member_count++;
  }

  // any user-defined exceptions
  if (tfunc->get_xceptions() != nullptr) {
    t_struct* txceptions = tfunc->get_xceptions();
    const vector<t_field*> members = txceptions->get_sorted_members();
    vector<t_field*>::const_iterator members_iter;
    for (members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
      t_field* xception_field = (*members_iter);
      if (member_count > 0) { return_struct << ", "; }
      return_struct << rust_field_name(xception_field) << ": None";
      member_count++;
    }
  }

  return_struct << " }";

  return  return_struct.str();
}